

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void setup_mem(MIR_mem_t mem,int *mod,int *rm,int *scale,int *base,int *rex_b,int *index,int *rex_x,
              int *disp8,int64_t *disp32)

{
  uint uVar1;
  int iVar2;
  int local_68;
  int local_64;
  int local_58;
  int local_54;
  MIR_disp_t disp;
  int *index_local;
  int *rex_b_local;
  int *base_local;
  int *scale_local;
  int *rm_local;
  int *mod_local;
  
  if (((*disp8 < 0) && (*disp32 < 0)) && (mem.index != 4)) {
    if ((mem.index == 0xffffffff) && (mem.base == 0xffffffff)) {
      setup_rm((int *)0x0,rm,4);
      *disp32 = mem.disp & 0xffffffff;
      setup_base((int *)0x0,base,5);
      setup_index((int *)0x0,index,4);
    }
    else {
      uVar1 = (uint)mem.disp;
      if ((mem.index == 0xffffffff) && ((mem.base != 4 && (mem.base != 0xc)))) {
        setup_rm(rex_b,rm,mem.base);
        if (((mem.disp == 0) && (mem.base != 5)) && (mem.base != 0xd)) {
          setup_mod(mod,0);
        }
        else {
          iVar2 = int8_p(mem.disp);
          if (iVar2 == 0) {
            setup_mod(mod,2);
            *disp32 = mem.disp & 0xffffffff;
          }
          else {
            setup_mod(mod,1);
            *disp8 = uVar1 & 0xff;
          }
        }
      }
      else if (mem.index == 0xffffffff) {
        setup_rm((int *)0x0,rm,4);
        setup_index((int *)0x0,index,4);
        setup_base(rex_b,base,mem.base);
        if (mem.disp == 0) {
          setup_mod(mod,0);
        }
        else {
          iVar2 = int8_p(mem.disp);
          if (iVar2 == 0) {
            setup_mod(mod,2);
            *disp32 = mem.disp & 0xffffffff;
          }
          else {
            setup_mod(mod,1);
            *disp8 = uVar1 & 0xff;
          }
        }
      }
      else if (mem.base == 0xffffffff) {
        setup_rm((int *)0x0,rm,4);
        setup_index(rex_x,index,mem.index);
        setup_base((int *)0x0,base,5);
        setup_mod(mod,0);
        *disp32 = mem.disp & 0xffffffff;
        if (mem.scale == '\x01') {
          local_54 = 0;
        }
        else {
          if (mem.scale == '\x02') {
            local_58 = 1;
          }
          else {
            local_58 = 3;
            if (mem.scale == '\x04') {
              local_58 = 2;
            }
          }
          local_54 = local_58;
        }
        setup_scale(scale,local_54);
      }
      else {
        setup_rm((int *)0x0,rm,4);
        setup_base(rex_b,base,mem.base);
        setup_index(rex_x,index,mem.index);
        if (mem.scale == '\x01') {
          local_64 = 0;
        }
        else {
          if (mem.scale == '\x02') {
            local_68 = 1;
          }
          else {
            local_68 = 3;
            if (mem.scale == '\x04') {
              local_68 = 2;
            }
          }
          local_64 = local_68;
        }
        setup_scale(scale,local_64);
        if (((mem.disp == 0) && (mem.base != 5)) && (mem.base != 0xd)) {
          setup_mod(mod,0);
        }
        else {
          iVar2 = int8_p(mem.disp);
          if (iVar2 == 0) {
            setup_mod(mod,2);
            *disp32 = mem.disp & 0xffffffff;
          }
          else {
            setup_mod(mod,1);
            *disp8 = uVar1 & 0xff;
          }
        }
      }
    }
    return;
  }
  __assert_fail("*disp8 < 0 && *disp32 < 0 && mem.index != SP_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x891,
                "void setup_mem(MIR_mem_t, int *, int *, int *, int *, int *, int *, int *, int *, int64_t *)"
               );
}

Assistant:

static void setup_mem (MIR_mem_t mem, int *mod, int *rm, int *scale, int *base, int *rex_b,
                       int *index, int *rex_x, int *disp8, int64_t *disp32) {
  MIR_disp_t disp = mem.disp;

  gen_assert (*disp8 < 0 && *disp32 < 0 && mem.index != SP_HARD_REG);
  if (mem.index == MIR_NON_VAR && mem.base == MIR_NON_VAR) { /* SIB: disp only */
    setup_rm (NULL, rm, 4);
    *disp32 = (uint32_t) disp;
    setup_base (NULL, base, BP_HARD_REG);
    setup_index (NULL, index, SP_HARD_REG);
  } else if (mem.index == MIR_NON_VAR && mem.base != SP_HARD_REG && mem.base != R12_HARD_REG) {
    setup_rm (rex_b, rm, mem.base);
    if (disp == 0 && mem.base != BP_HARD_REG && mem.base != R13_HARD_REG) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  } else if (mem.index == MIR_NON_VAR) { /* SIB: only base = sp or r12 */
    setup_rm (NULL, rm, 4);
    setup_index (NULL, index, SP_HARD_REG);
    setup_base (rex_b, base, mem.base);
    if (disp == 0) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  } else if (mem.base == MIR_NON_VAR) { /* SIB: index with scale only */
    setup_rm (NULL, rm, 4);
    setup_index (rex_x, index, mem.index);
    setup_base (NULL, base, BP_HARD_REG);
    setup_mod (mod, 0);
    *disp32 = (uint32_t) disp;
    setup_scale (scale, mem.scale == 1 ? 0 : mem.scale == 2 ? 1 : mem.scale == 4 ? 2 : 3);
  } else { /* SIB: base and index */
    setup_rm (NULL, rm, 4);
    setup_base (rex_b, base, mem.base);
    setup_index (rex_x, index, mem.index);
    setup_scale (scale, mem.scale == 1 ? 0 : mem.scale == 2 ? 1 : mem.scale == 4 ? 2 : 3);
    if (disp == 0 && mem.base != BP_HARD_REG && mem.base != R13_HARD_REG) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  }
}